

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::
markRenderAttributeBufferUpdated(ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *in_stack_00000060;
  DeviceBufferType in_stack_000000ac;
  ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *in_stack_000000b0;
  
  checkDeviceBufferTypeIs(in_stack_000000b0,in_stack_000000ac);
  invalidateHostBuffer((ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *)0x430a44);
  updateIndexedViews(in_stack_00000060);
  requestRedraw();
  return;
}

Assistant:

void ManagedBuffer<T>::markRenderAttributeBufferUpdated() {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  invalidateHostBuffer();
  updateIndexedViews();
  requestRedraw();
}